

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

ssize_t sf_parse_inner_list(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  ssize_t sVar1;
  ssize_t slen;
  uint8_t *p;
  uint8_t *end_local;
  uint8_t *begin_local;
  nghttp2_sf_value *dest_local;
  
  slen = (ssize_t)(begin + 1);
  if (*begin == '(') {
    do {
      while( true ) {
        if ((uint8_t *)slen == end) {
          return -1;
        }
        if (*(char *)slen != ' ') break;
        slen = slen + 1;
      }
      if (*(char *)slen == ')') {
        sVar1 = sf_parse_params((uint8_t *)(slen + 1),end);
        if (-1 < sVar1) {
          if (dest != (nghttp2_sf_value *)0x0) {
            dest->type = '\x06';
          }
          return (ssize_t)((uint8_t *)(slen + 1) + (sVar1 - (long)begin));
        }
        return -1;
      }
      sVar1 = sf_parse_item((nghttp2_sf_value *)0x0,(uint8_t *)slen,end);
      if (sVar1 < 0) {
        return -1;
      }
      slen = sVar1 + slen;
    } while (((uint8_t *)slen != end) && ((*(uint8_t *)slen == ' ' || (*(uint8_t *)slen == ')'))));
  }
  return -1;
}

Assistant:

static ssize_t sf_parse_inner_list(nghttp2_sf_value *dest, const uint8_t *begin,
                                   const uint8_t *end) {
  const uint8_t *p = begin;
  ssize_t slen;

  if (*p++ != '(') {
    return -1;
  }

  for (;;) {
    sf_discard_sp_end_err(p, end, -1);

    if (*p == ')') {
      ++p;

      slen = sf_parse_params(p, end);
      if (slen < 0) {
        return -1;
      }

      p += slen;

      if (dest) {
        dest->type = NGHTTP2_SF_VALUE_TYPE_INNER_LIST;
      }

      return p - begin;
    }

    slen = sf_parse_item(NULL, p, end);
    if (slen < 0) {
      return -1;
    }

    p += slen;

    if (p == end || (*p != ' ' && *p != ')')) {
      return -1;
    }
  }
}